

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

void SL::WS_LITE::
     handleclose<std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,unsigned_short code,string *msg)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  error_code ec;
  unsigned_short local_19a;
  shared_ptr<SL::WS_LITE::IWebSocket> local_198 [7];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Closed: ",8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  Log(INFO_log_level,
      "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
      ,0xdd,"handleclose",(ostringstream *)local_198);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar1->SocketStatus_ = CLOSED;
  peVar1->Writing = NOTWRITING;
  peVar2 = (peVar1->Parent).
           super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2->onDisconnection).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (socket->
             super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    if (local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_19a = code;
    local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &peVar1->super_IWebSocket;
    if ((peVar2->onDisconnection).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(peVar2->onDisconnection)._M_invoker)
              ((_Any_data *)&peVar2->onDisconnection,local_198,&local_19a,msg);
    if (local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198[0].
                 super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  std::deque<SL::WS_LITE::SendQueueItem,_std::allocator<SL::WS_LITE::SendQueueItem>_>::clear
            (&((socket->
               super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->SendMessageQueue);
  WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>::canceltimers
            ((socket->
             super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr & 0xffffffff00000000);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::_V2::system_category();
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  asio::detail::reactive_socket_service<asio::ip::tcp>::shutdown
            ((peVar1->Socket).super_basic_socket<asio::ip::tcp>.
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
             service_,(int)peVar1 + 0x58,2);
  local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr & 0xffffffff00000000);
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_198[0].super___shared_ptr<SL::WS_LITE::IWebSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  asio::detail::reactive_socket_service_base::close
            (&((peVar1->Socket).super_basic_socket<asio::ip::tcp>.
               super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
              service_)->super_reactive_socket_service_base,(int)peVar1 + 0x58);
  return;
}

Assistant:

inline void handleclose(const SOCKETTYPE &socket, unsigned short code, const std::string &msg)
    {
        SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Closed: " << code);
        socket->SocketStatus_ = SocketStatus::CLOSED;
        socket->Writing = SocketIOStatus::NOTWRITING;
        if (socket->Parent->onDisconnection) {
            socket->Parent->onDisconnection(socket, code, msg);
        }

        socket->SendMessageQueue.clear(); // clear all outbound messages
        socket->canceltimers();
        std::error_code ec;
        socket->Socket.lowest_layer().shutdown(asio::ip::tcp::socket::shutdown_both, ec);
        ec.clear();
        socket->Socket.lowest_layer().close(ec);
    }